

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<long>::PrepareZ
          (TPZMatrix<long> *this,TPZFMatrix<long> *y,TPZFMatrix<long> *z,long beta,int opt)

{
  int64_t iVar1;
  long *plVar2;
  long in_RCX;
  TPZFMatrix<long> *in_RDX;
  TPZFMatrix<long> *in_RSI;
  TPZBaseMatrix *in_RDI;
  int in_R8D;
  int64_t i;
  long *yp;
  long *zlast;
  long *zp;
  int64_t ic;
  int64_t xcols;
  int64_t numeq;
  long local_70;
  long in_stack_ffffffffffffffa0;
  long *in_stack_ffffffffffffffa8;
  TPZFMatrix<long> *in_stack_ffffffffffffffb0;
  TPZFMatrix<long> *local_48;
  long local_40;
  
  if (in_R8D == 0) {
    local_70 = TPZBaseMatrix::Rows(in_RDI);
  }
  else {
    local_70 = TPZBaseMatrix::Cols(in_RDI);
  }
  iVar1 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  (*(in_RDX->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (in_RDX,local_70,iVar1);
  for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
    local_48 = (TPZFMatrix<long> *)
               TPZFMatrix<long>::operator()
                         (in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8,
                          in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffffb0 =
         (TPZFMatrix<long> *)
         (&((TPZFMatrix<long> *)(&local_48->fPivot + -1))->fElem + local_70 + -4);
    if (in_RCX == 0) {
      for (; local_48 != in_stack_ffffffffffffffb0;
          local_48 = (TPZFMatrix<long> *)&(local_48->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow
          ) {
        (local_48->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)0x0;
      }
    }
    else {
      in_stack_ffffffffffffffa8 = TPZFMatrix<long>::g(in_RSI,0,local_40);
      if (in_RDX != in_RSI) {
        memcpy(local_48,in_stack_ffffffffffffffa8,local_70 << 3);
      }
      for (in_stack_ffffffffffffffa0 = 0; in_stack_ffffffffffffffa0 < local_70;
          in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + 1) {
        plVar2 = TPZFMatrix<long>::operator()
                           (in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8,
                            in_stack_ffffffffffffffa0);
        *plVar2 = in_RCX * *plVar2;
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}